

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::qualConstraintViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  int iVar1;
  SVectorBase<double> *this_00;
  double *pdVar2;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  double *in_RSI;
  long *in_RDI;
  double viol;
  int col;
  double val;
  SVectorBase<double> *rowvec;
  int row;
  VectorBase<double> solu;
  double in_stack_ffffffffffffff28;
  SPxLPBase<double> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  double dVar3;
  VectorBase<double> *in_stack_ffffffffffffff40;
  double local_60;
  uint local_54;
  double local_50;
  int local_40;
  undefined1 local_30 [24];
  double *local_18;
  double *local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = (double *)CONCAT44(in_register_00000014,in_EDX);
  *in_RSI = 0.0;
  *local_18 = 0.0;
  local_10 = in_RSI;
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x252e0f);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff40,iVar1);
  (**(code **)(*in_RDI + 0x300))(in_RDI,local_30);
  for (local_40 = 0; iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x252e5b),
      local_40 < iVar1; local_40 = local_40 + 1) {
    this_00 = SPxLPBase<double>::rowVector
                        (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_50 = 0.0;
    for (local_54 = 0; iVar1 = SVectorBase<double>::size(this_00), (int)local_54 < iVar1;
        local_54 = local_54 + 1) {
      pdVar2 = SVectorBase<double>::value(this_00,local_54);
      dVar3 = *pdVar2;
      SVectorBase<double>::index(this_00,(char *)(ulong)local_54,__c);
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff30,
                          (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_50 = dVar3 * *pdVar2 + local_50;
    }
    local_60 = 0.0;
    pdVar2 = SPxLPBase<double>::lhs
                       (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if (*pdVar2 <= local_50) {
      dVar3 = local_50;
      pdVar2 = SPxLPBase<double>::rhs(in_stack_ffffffffffffff30,iVar1);
      if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
        in_stack_ffffffffffffff30 =
             (SPxLPBase<double> *)
             SPxLPBase<double>::rhs(in_stack_ffffffffffffff30,(int)((ulong)local_50 >> 0x20));
        local_60 = spxAbs<double>(local_50 -
                                  (double)(in_stack_ffffffffffffff30->super_LPRowSetBase<double>).
                                          super_SVSetBase<double>.
                                          super_ClassArray<soplex::Nonzero<double>_>.
                                          _vptr_ClassArray);
        in_stack_ffffffffffffff28 = local_50;
      }
    }
    else {
      pdVar2 = SPxLPBase<double>::lhs(in_stack_ffffffffffffff30,iVar1);
      local_60 = spxAbs<double>(local_50 - *pdVar2);
    }
    if (*local_10 <= local_60 && local_60 != *local_10) {
      *local_10 = local_60;
    }
    *local_18 = local_60 + *local_18;
  }
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x2530d8);
  return;
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}